

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall Stack2_base_push_pop_head_Test::TestBody(Stack2_base_push_pop_head_Test *this)

{
  bool bVar1;
  char *pcVar2;
  SimpleStack<int> *pSVar3;
  int *piVar4;
  char *in_R9;
  AssertHelper local_178;
  Message local_170;
  int local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_2;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__1;
  Message local_d0;
  int local_c4;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  AssertHelper local_68;
  Message local_60;
  bool local_51;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  Stack<SimpleStack<int>_> r;
  int local_30 [4];
  SimpleStack<int> local_20;
  SimpleStack<int> s1;
  SimpleStack<int> s;
  Stack2_base_push_pop_head_Test *this_local;
  
  SimpleStack<int>::SimpleStack(&s1);
  SimpleStack<int>::SimpleStack(&local_20);
  local_30[0] = 0x4d2;
  SimpleStack<int>::push(&s1,local_30);
  r.top._4_4_ = 0xd80;
  SimpleStack<int>::push(&local_20,(int *)((long)&r.top + 4));
  Stack<SimpleStack<int>_>::Stack((Stack<SimpleStack<int>_> *)&gtest_ar_.message_);
  bVar1 = Stack::operator_cast_to_bool((Stack *)&gtest_ar_.message_);
  local_51 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_50,&local_51,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_50,(AssertionResult *)"!r","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x54,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  Stack<SimpleStack<int>_>::push((Stack<SimpleStack<int>_> *)&gtest_ar_.message_,&s1);
  pSVar3 = Stack<SimpleStack<int>_>::head((Stack<SimpleStack<int>_> *)&gtest_ar_.message_);
  piVar4 = SimpleStack<int>::head(pSVar3);
  local_9c = 0x4d2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_98,"r.head().head()","1234",piVar4,&local_9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x56,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  Stack<SimpleStack<int>_>::push((Stack<SimpleStack<int>_> *)&gtest_ar_.message_,&local_20);
  pSVar3 = Stack<SimpleStack<int>_>::head((Stack<SimpleStack<int>_> *)&gtest_ar_.message_);
  piVar4 = SimpleStack<int>::head(pSVar3);
  local_c4 = 0xd80;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_c0,"r.head().head()","3456",piVar4,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x58,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  bVar1 = SimpleStack::operator_cast_to_bool((SimpleStack *)&s1);
  local_e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)local_e8,(AssertionResult *)"!s","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x59,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  Stack<SimpleStack<int>_>::pop((Stack<SimpleStack<int>_> *)&gtest_ar_2.message_);
  SimpleStack<int>::operator=(&s1,(SimpleStack<int> *)&gtest_ar_2.message_);
  SimpleStack<int>::~SimpleStack((SimpleStack<int> *)&gtest_ar_2.message_);
  pSVar3 = Stack<SimpleStack<int>_>::head((Stack<SimpleStack<int>_> *)&gtest_ar_.message_);
  piVar4 = SimpleStack<int>::head(pSVar3);
  local_13c = 0x4d2;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_138,"r.head().head()","1234",piVar4,&local_13c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  piVar4 = SimpleStack<int>::head(&s1);
  local_164 = 0xd80;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_160,"s.head()","3456",piVar4,&local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/NickTikhomirov[P]AYA3_5/tests/test.cpp"
               ,0x5c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  Stack<SimpleStack<int>_>::~Stack((Stack<SimpleStack<int>_> *)&gtest_ar_.message_);
  SimpleStack<int>::~SimpleStack(&local_20);
  SimpleStack<int>::~SimpleStack(&s1);
  return;
}

Assistant:

TEST(Stack2_base, push_pop_head) {
	SimpleStack<int> s;
	SimpleStack<int> s1;
	s.push(1234);
	s1.push(3456);
	Stack<SimpleStack<int>> r;
	EXPECT_TRUE(!r);
	r.push(std::move(s));
	EXPECT_EQ(r.head().head(), 1234);
	r.push(std::move(s1));
	EXPECT_EQ(r.head().head(), 3456);
	EXPECT_TRUE(!s);
	s = std::move(r.pop());
	EXPECT_EQ(r.head().head(), 1234);
	EXPECT_EQ(s.head(), 3456);
}